

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileUtilityTargetGenerator::~cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this)

{
  ~cmMakefileUtilityTargetGenerator(this);
  operator_delete(this,0x400);
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::~cmMakefileUtilityTargetGenerator()
{
  delete this->OSXBundleGenerator;
}